

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aesni.c
# Opt level: O1

void mbedtls_aesni_gcm_mult(uchar *c,uchar *a,uchar *b)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auVar14 [16];
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  uchar uStack_39;
  uchar cc [16];
  uchar bb [16];
  uchar aa [16];
  ulong uVar13;
  
  lVar10 = 0x10;
  lVar11 = 0;
  do {
    aa[lVar11] = a[lVar10 + -1];
    bb[lVar11] = b[lVar10 + -1];
    lVar11 = lVar11 + 1;
    lVar10 = lVar10 + -1;
  } while (lVar10 != 0);
  auVar19._8_8_ = 0;
  auVar19[0] = bb[0];
  auVar19[1] = bb[1];
  auVar19[2] = bb[2];
  auVar19[3] = bb[3];
  auVar19[4] = bb[4];
  auVar19[5] = bb[5];
  auVar19[6] = bb[6];
  auVar19[7] = bb[7];
  auVar2._8_8_ = 0;
  auVar2[0] = aa[0];
  auVar2[1] = aa[1];
  auVar2[2] = aa[2];
  auVar2[3] = aa[3];
  auVar2[4] = aa[4];
  auVar2[5] = aa[5];
  auVar2[6] = aa[6];
  auVar2[7] = aa[7];
  auVar14 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar19 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar14 = auVar14 ^ auVar2 << uVar1;
    }
  }
  auVar7._8_8_ = 0;
  auVar7[0] = bb[8];
  auVar7[1] = bb[9];
  auVar7[2] = bb[10];
  auVar7[3] = bb[0xb];
  auVar7[4] = bb[0xc];
  auVar7[5] = bb[0xd];
  auVar7[6] = bb[0xe];
  auVar7[7] = bb[0xf];
  auVar8._8_8_ = 0;
  auVar8[0] = aa[8];
  auVar8[1] = aa[9];
  auVar8[2] = aa[10];
  auVar8[3] = aa[0xb];
  auVar8[4] = aa[0xc];
  auVar8[5] = aa[0xd];
  auVar8[6] = aa[0xe];
  auVar8[7] = aa[0xf];
  auVar19 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar7 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar19 = auVar19 ^ auVar8 << uVar1;
    }
  }
  auVar5._8_8_ = 0;
  auVar5[0] = bb[0];
  auVar5[1] = bb[1];
  auVar5[2] = bb[2];
  auVar5[3] = bb[3];
  auVar5[4] = bb[4];
  auVar5[5] = bb[5];
  auVar5[6] = bb[6];
  auVar5[7] = bb[7];
  auVar6._8_8_ = 0;
  auVar6[0] = aa[8];
  auVar6[1] = aa[9];
  auVar6[2] = aa[10];
  auVar6[3] = aa[0xb];
  auVar6[4] = aa[0xc];
  auVar6[5] = aa[0xd];
  auVar6[6] = aa[0xe];
  auVar6[7] = aa[0xf];
  auVar2 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar5 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar2 = auVar2 ^ auVar6 << uVar1;
    }
  }
  auVar3._8_8_ = 0;
  auVar3[0] = bb[8];
  auVar3[1] = bb[9];
  auVar3[2] = bb[10];
  auVar3[3] = bb[0xb];
  auVar3[4] = bb[0xc];
  auVar3[5] = bb[0xd];
  auVar3[6] = bb[0xe];
  auVar3[7] = bb[0xf];
  auVar4._8_8_ = 0;
  auVar4[0] = aa[0];
  auVar4[1] = aa[1];
  auVar4[2] = aa[2];
  auVar4[3] = aa[3];
  auVar4[4] = aa[4];
  auVar4[5] = aa[5];
  auVar4[6] = aa[6];
  auVar4[7] = aa[7];
  auVar7 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar3 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar7 = auVar7 ^ auVar4 << uVar1;
    }
  }
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SUB168(auVar7 ^ auVar2,0);
  auVar19 = auVar19 ^ (auVar7 ^ auVar2) >> 0x40;
  auVar14 = auVar14 ^ auVar9 << 0x40;
  uVar13 = auVar14._0_8_;
  uVar15 = auVar14._8_8_;
  uVar12 = uVar13 << 1;
  uVar18 = auVar19._0_8_;
  uVar16 = uVar15 << 1 | uVar13 >> 0x3f;
  uVar17 = uVar16 ^ uVar13 << 0x3f ^ uVar13 << 0x3a;
  uVar12 = uVar13 & 0x7fffffffffffffff ^ uVar12 >> 2 ^ uVar12 >> 7 ^
           (uVar13 >> 0x3f) << 0x3f ^ uVar16 << 0x3e ^ uVar16 << 0x39 ^ uVar12 ^
           (uVar18 << 1 | uVar15 >> 0x3f);
  uVar13 = uVar17 >> 1 ^ uVar17 >> 2 ^ uVar17 >> 7 ^ uVar17 ^ (auVar19._8_8_ << 1 | uVar18 >> 0x3f);
  cc[0] = (char)uVar12;
  cc[1] = (char)(uVar12 >> 8);
  cc[2] = (char)(uVar12 >> 0x10);
  cc[3] = (char)(uVar12 >> 0x18);
  cc[4] = (char)(uVar12 >> 0x20);
  cc[5] = (char)(uVar12 >> 0x28);
  cc[6] = (char)(uVar12 >> 0x30);
  cc[7] = (char)(uVar12 >> 0x38);
  cc[8] = (char)uVar13;
  cc[9] = (char)(uVar13 >> 8);
  cc[10] = (char)(uVar13 >> 0x10);
  cc[0xb] = (char)(uVar13 >> 0x18);
  cc[0xc] = (char)(uVar13 >> 0x20);
  cc[0xd] = (char)(uVar13 >> 0x28);
  cc[0xe] = (char)(uVar13 >> 0x30);
  cc[0xf] = (char)(uVar13 >> 0x38);
  lVar10 = 0x10;
  do {
    *c = cc[lVar10 + -1];
    c = c + 1;
    lVar10 = lVar10 + -1;
  } while (lVar10 != 0);
  return;
}

Assistant:

void mbedtls_aesni_gcm_mult( unsigned char c[16],
                     const unsigned char a[16],
                     const unsigned char b[16] )
{
    unsigned char aa[16], bb[16], cc[16];
    size_t i;

    /* The inputs are in big-endian order, so byte-reverse them */
    for( i = 0; i < 16; i++ )
    {
        aa[i] = a[15 - i];
        bb[i] = b[15 - i];
    }

    asm( "movdqu (%0), %%xmm0               \n\t" // a1:a0
         "movdqu (%1), %%xmm1               \n\t" // b1:b0

         /*
          * Caryless multiplication xmm2:xmm1 = xmm0 * xmm1
          * using [CLMUL-WP] algorithm 1 (p. 13).
          */
         "movdqa %%xmm1, %%xmm2             \n\t" // copy of b1:b0
         "movdqa %%xmm1, %%xmm3             \n\t" // same
         "movdqa %%xmm1, %%xmm4             \n\t" // same
         PCLMULQDQ xmm0_xmm1 ",0x00         \n\t" // a0*b0 = c1:c0
         PCLMULQDQ xmm0_xmm2 ",0x11         \n\t" // a1*b1 = d1:d0
         PCLMULQDQ xmm0_xmm3 ",0x10         \n\t" // a0*b1 = e1:e0
         PCLMULQDQ xmm0_xmm4 ",0x01         \n\t" // a1*b0 = f1:f0
         "pxor %%xmm3, %%xmm4               \n\t" // e1+f1:e0+f0
         "movdqa %%xmm4, %%xmm3             \n\t" // same
         "psrldq $8, %%xmm4                 \n\t" // 0:e1+f1
         "pslldq $8, %%xmm3                 \n\t" // e0+f0:0
         "pxor %%xmm4, %%xmm2               \n\t" // d1:d0+e1+f1
         "pxor %%xmm3, %%xmm1               \n\t" // c1+e0+f1:c0

         /*
          * Now shift the result one bit to the left,
          * taking advantage of [CLMUL-WP] eq 27 (p. 20)
          */
         "movdqa %%xmm1, %%xmm3             \n\t" // r1:r0
         "movdqa %%xmm2, %%xmm4             \n\t" // r3:r2
         "psllq $1, %%xmm1                  \n\t" // r1<<1:r0<<1
         "psllq $1, %%xmm2                  \n\t" // r3<<1:r2<<1
         "psrlq $63, %%xmm3                 \n\t" // r1>>63:r0>>63
         "psrlq $63, %%xmm4                 \n\t" // r3>>63:r2>>63
         "movdqa %%xmm3, %%xmm5             \n\t" // r1>>63:r0>>63
         "pslldq $8, %%xmm3                 \n\t" // r0>>63:0
         "pslldq $8, %%xmm4                 \n\t" // r2>>63:0
         "psrldq $8, %%xmm5                 \n\t" // 0:r1>>63
         "por %%xmm3, %%xmm1                \n\t" // r1<<1|r0>>63:r0<<1
         "por %%xmm4, %%xmm2                \n\t" // r3<<1|r2>>62:r2<<1
         "por %%xmm5, %%xmm2                \n\t" // r3<<1|r2>>62:r2<<1|r1>>63

         /*
          * Now reduce modulo the GCM polynomial x^128 + x^7 + x^2 + x + 1
          * using [CLMUL-WP] algorithm 5 (p. 20).
          * Currently xmm2:xmm1 holds x3:x2:x1:x0 (already shifted).
          */
         /* Step 2 (1) */
         "movdqa %%xmm1, %%xmm3             \n\t" // x1:x0
         "movdqa %%xmm1, %%xmm4             \n\t" // same
         "movdqa %%xmm1, %%xmm5             \n\t" // same
         "psllq $63, %%xmm3                 \n\t" // x1<<63:x0<<63 = stuff:a
         "psllq $62, %%xmm4                 \n\t" // x1<<62:x0<<62 = stuff:b
         "psllq $57, %%xmm5                 \n\t" // x1<<57:x0<<57 = stuff:c

         /* Step 2 (2) */
         "pxor %%xmm4, %%xmm3               \n\t" // stuff:a+b
         "pxor %%xmm5, %%xmm3               \n\t" // stuff:a+b+c
         "pslldq $8, %%xmm3                 \n\t" // a+b+c:0
         "pxor %%xmm3, %%xmm1               \n\t" // x1+a+b+c:x0 = d:x0

         /* Steps 3 and 4 */
         "movdqa %%xmm1,%%xmm0              \n\t" // d:x0
         "movdqa %%xmm1,%%xmm4              \n\t" // same
         "movdqa %%xmm1,%%xmm5              \n\t" // same
         "psrlq $1, %%xmm0                  \n\t" // e1:x0>>1 = e1:e0'
         "psrlq $2, %%xmm4                  \n\t" // f1:x0>>2 = f1:f0'
         "psrlq $7, %%xmm5                  \n\t" // g1:x0>>7 = g1:g0'
         "pxor %%xmm4, %%xmm0               \n\t" // e1+f1:e0'+f0'
         "pxor %%xmm5, %%xmm0               \n\t" // e1+f1+g1:e0'+f0'+g0'
         // e0'+f0'+g0' is almost e0+f0+g0, ex\tcept for some missing
         // bits carried from d. Now get those\t bits back in.
         "movdqa %%xmm1,%%xmm3              \n\t" // d:x0
         "movdqa %%xmm1,%%xmm4              \n\t" // same
         "movdqa %%xmm1,%%xmm5              \n\t" // same
         "psllq $63, %%xmm3                 \n\t" // d<<63:stuff
         "psllq $62, %%xmm4                 \n\t" // d<<62:stuff
         "psllq $57, %%xmm5                 \n\t" // d<<57:stuff
         "pxor %%xmm4, %%xmm3               \n\t" // d<<63+d<<62:stuff
         "pxor %%xmm5, %%xmm3               \n\t" // missing bits of d:stuff
         "psrldq $8, %%xmm3                 \n\t" // 0:missing bits of d
         "pxor %%xmm3, %%xmm0               \n\t" // e1+f1+g1:e0+f0+g0
         "pxor %%xmm1, %%xmm0               \n\t" // h1:h0
         "pxor %%xmm2, %%xmm0               \n\t" // x3+h1:x2+h0

         "movdqu %%xmm0, (%2)               \n\t" // done
         :
         : "r" (aa), "r" (bb), "r" (cc)
         : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5" );

    /* Now byte-reverse the outputs */
    for( i = 0; i < 16; i++ )
        c[i] = cc[15 - i];

    return;
}